

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magnet_uri.cpp
# Opt level: O0

add_torrent_params * __thiscall
libtorrent::parse_magnet_uri
          (add_torrent_params *__return_storage_ptr__,libtorrent *this,string_view uri,
          error_code *ec)

{
  string_view uri_00;
  storage_constructor_type local_50;
  undefined1 local_29;
  error_code *local_28;
  error_code *ec_local;
  string_view uri_local;
  add_torrent_params *ret;
  
  local_28 = (error_code *)uri.len_;
  uri_local.ptr_ = uri.ptr_;
  local_29 = 0;
  ec_local = (error_code *)this;
  uri_local.len_ = (size_t)__return_storage_ptr__;
  std::
  function<libtorrent::storage_interface*(libtorrent::storage_params_const&,libtorrent::file_pool&)>
  ::
  function<libtorrent::storage_interface*(&)(libtorrent::storage_params_const&,libtorrent::file_pool&),void>
            ((function<libtorrent::storage_interface*(libtorrent::storage_params_const&,libtorrent::file_pool&)>
              *)&local_50,default_storage_constructor);
  add_torrent_params::add_torrent_params(__return_storage_ptr__,&local_50);
  std::
  function<libtorrent::storage_interface_*(const_libtorrent::storage_params_&,_libtorrent::file_pool_&)>
  ::~function(&local_50);
  uri_00.len_ = (size_t)uri_local.ptr_;
  uri_00.ptr_ = (char *)ec_local;
  parse_magnet_uri(uri_00,__return_storage_ptr__,local_28);
  return __return_storage_ptr__;
}

Assistant:

add_torrent_params parse_magnet_uri(string_view uri, error_code& ec)
	{
		add_torrent_params ret;
		parse_magnet_uri(uri, ret, ec);
		return ret;
	}